

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void tests::hylo_performance(void)

{
  double dVar1;
  NS *graph;
  N *this;
  N *this_00;
  N *pNVar2;
  ostream *poVar3;
  _Vector_base<N_*,_std::allocator<N_*>_> *this_01;
  _Vector_base<N_*,_std::allocator<N_*>_> local_88;
  Alg<double> local_70;
  CoAlg<int> local_50;
  
  graph = (NS *)operator_new(0x18);
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this,"Left");
  this_00 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_00,"Right");
  std::chrono::_V2::system_clock::now();
  pNVar2 = (N *)N::operator_new(0x78,graph);
  (pNVar2->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar2->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar2->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pNVar2->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar2->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar2->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pNVar2->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar2->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar2->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   &(pNVar2->data).
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>._M_u = 1000000
  ;
  *(__index_type *)
   ((long)&(pNVar2->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*> + 0x20)
       = '\x01';
  coalg::rand_btree(&local_50,graph,this,this_00);
  pNVar2 = N::ana<int>(pNVar2,&local_50);
  alg::btree_avg(this,this_00);
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = N::histo<double>(pNVar2,&local_70,(vector<N_*,_std::allocator<N_*>_> *)&local_88);
  std::_Vector_base<N_*,_std::allocator<N_*>_>::~_Vector_base(&local_88);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>(dVar1);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  this_01 = (_Vector_base<N_*,_std::allocator<N_*>_> *)NS::clear(graph);
  if (this_01 != (_Vector_base<N_*,_std::allocator<N_*>_> *)0x0) {
    std::_Vector_base<N_*,_std::allocator<N_*>_>::~_Vector_base(this_01);
  }
  operator_delete(this_01,0x18);
  return;
}

Assistant:

void hylo_performance() {
        //             ana       cata      hylo
        // C++ T      6159555   3626070    9497513
        // Python    33156637  10476905   46028639
        // Python T 697323327 668245419 1467391795
        auto expr = new NS();
        auto left = new(expr) N("Left"), right = new(expr) N("Right");

        auto start = high_resolution_clock::now();
        auto res = (new(expr) N(1000000))->
                ana(coalg::rand_btree(expr, left, right))->
                histo(alg::btree_avg(left, right));
        auto stop = high_resolution_clock::now();

        auto duration = duration_cast<nanoseconds>(stop - start);
        cout << res << ", " << duration.count() << endl;

        delete expr->clear();
    }